

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_FindAndCountAndEqualRange_Test<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_FindAndCountAndEqualRange_Test<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  iterator it_00;
  bool bVar1;
  key_type *key;
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *this_00;
  AssertHelper *this_01;
  char *expression_text;
  AssertionResult *assertion_result;
  char *actual_predicate_value;
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *this_02;
  AssertHelper *this_03;
  char *pcVar2;
  key_type file;
  long in_RDI;
  AssertionResult gtest_ar__23;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar__22;
  AssertionResult gtest_ar__21;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar__20;
  AssertionResult gtest_ar__19;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar__18;
  AssertionResult gtest_ar__17;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar__16;
  AssertionResult gtest_ar__15;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar__14;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar__13;
  AssertionResult gtest_ar__12;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar__11;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar__10;
  AssertionResult gtest_ar__9;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar__8;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar__7;
  AssertionResult gtest_ar__6;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar__4;
  TypeParam ht;
  AssertionResult gtest_ar_2;
  const_iterator it;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  pair<google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  const_eq_pair;
  pair<google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  eq_pair;
  key_type *in_stack_ffffffffffffea88;
  HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *key_00;
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffea90;
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *this_04;
  HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffea98;
  char **lhs;
  char *in_stack_ffffffffffffeaa0;
  char *message;
  undefined4 in_stack_ffffffffffffeaa8;
  int in_stack_ffffffffffffeaac;
  pair<google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  *this_05;
  HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffeab0;
  undefined4 in_stack_ffffffffffffeab8;
  Type in_stack_ffffffffffffeabc;
  AssertHelper *in_stack_ffffffffffffeac0;
  key_type *in_stack_ffffffffffffeac8;
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffead0;
  char *in_stack_ffffffffffffeaf0;
  char *in_stack_ffffffffffffeaf8;
  char *in_stack_ffffffffffffeb00;
  value_type *in_stack_ffffffffffffeb08;
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffeb10;
  key_type *in_stack_ffffffffffffeb58;
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffeb60;
  string local_1248 [55];
  undefined1 local_1211;
  AssertionResult local_1210;
  key_type local_1200;
  pair<google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  local_11f8;
  key_type local_11a8;
  AssertHelper *local_11a0;
  undefined4 local_1194;
  AssertionResult local_1190;
  string local_1180 [48];
  const_iterator local_1150;
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *local_1130;
  dense_hashtable_const_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  local_1128;
  undefined1 local_1101;
  AssertionResult local_1100;
  string local_10f0 [55];
  undefined1 local_10b9;
  AssertionResult local_10b8;
  key_type local_10a8;
  pair<google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  local_10a0;
  AssertionResult *local_1050;
  char *local_1048;
  undefined4 local_103c;
  AssertionResult local_1038;
  string local_1028 [48];
  iterator local_ff8;
  key_type local_fd8;
  dense_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  local_fd0;
  undefined1 local_fa9;
  AssertionResult local_fa8;
  string local_f98 [55];
  undefined1 local_f61;
  AssertionResult local_f60;
  key_type local_f50;
  pair<google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  local_f48;
  key_type local_ef8;
  size_type local_ef0;
  undefined4 local_ee4;
  AssertionResult local_ee0;
  string local_ed0 [48];
  const_iterator local_ea0;
  key_type local_e80;
  dense_hashtable_const_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  local_e78;
  undefined1 local_e51;
  AssertionResult local_e50;
  string local_e40 [55];
  undefined1 local_e09;
  AssertionResult local_e08;
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *local_df8;
  pair<google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  local_df0;
  key_type local_da0;
  size_type local_d98;
  undefined4 local_d8c;
  AssertionResult local_d88;
  string local_d78 [48];
  iterator local_d48;
  key_type local_d28;
  dense_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  local_d20;
  undefined1 local_cf9;
  AssertionResult local_cf8;
  string local_ce8 [55];
  undefined1 local_cb1;
  AssertionResult local_cb0 [2];
  key_type local_c90;
  key_type local_c88;
  AssertionResult local_c80;
  string local_c70 [55];
  undefined1 local_c39;
  AssertionResult local_c38;
  key_type local_c28;
  pair<google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  local_c20;
  key_type local_bd0;
  size_type local_bc8;
  undefined4 local_bbc;
  AssertionResult local_bb8;
  string local_ba8 [48];
  const_iterator local_b78;
  key_type local_b58;
  dense_hashtable_const_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  local_b50;
  undefined1 local_b29;
  AssertionResult local_b28;
  string local_b18 [55];
  undefined1 local_ae1;
  AssertionResult local_ae0 [2];
  key_type local_ac0;
  key_type local_ab8;
  AssertionResult local_ab0;
  string local_aa0 [55];
  undefined1 local_a69;
  AssertionResult local_a68;
  key_type local_a58;
  pair<google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  local_a50;
  key_type local_a00;
  size_type local_9f8;
  undefined4 local_9ec;
  AssertionResult local_9e8;
  string local_9d8 [48];
  iterator local_9a8;
  key_type local_988;
  dense_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  local_980;
  undefined1 local_959;
  AssertionResult local_958;
  string local_948 [55];
  undefined1 local_911;
  AssertionResult local_910 [2];
  key_type local_8f0;
  key_type local_8e8;
  AssertionResult local_8e0;
  string local_8d0 [55];
  undefined1 local_899;
  AssertionResult local_898;
  key_type local_888;
  pair<google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  local_880;
  key_type local_830;
  size_type local_828;
  undefined4 local_81c;
  AssertionResult local_818;
  string local_808 [48];
  const_iterator local_7d8;
  key_type local_7b8;
  dense_hashtable_const_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  local_7b0;
  undefined1 local_789;
  AssertionResult local_788;
  string local_778 [55];
  undefined1 local_741;
  AssertionResult local_740 [2];
  key_type local_720;
  key_type local_718;
  AssertionResult local_710;
  string local_700 [55];
  undefined1 local_6c9;
  AssertionResult local_6c8;
  key_type local_6b8;
  pair<google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  local_6b0;
  key_type local_660;
  size_type local_658;
  undefined4 local_64c;
  AssertionResult local_648;
  string local_638 [48];
  iterator local_608;
  key_type local_5e8;
  dense_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  local_5e0;
  undefined1 local_5b9;
  AssertionResult local_5b8 [10];
  key_type local_510;
  key_type local_508;
  AssertionResult local_500;
  key_type local_4f0;
  HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *local_4e8;
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *local_4e0;
  char **local_4d8;
  char *local_4d0;
  size_type local_498;
  undefined4 local_48c;
  AssertionResult local_488 [29];
  string local_2b8 [55];
  byte local_281;
  AssertionResult local_280 [4];
  string local_238 [55];
  undefined1 local_201;
  AssertionResult local_200;
  key_type local_1f0;
  pair<google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  local_1e8;
  key_type local_198;
  size_type local_190;
  undefined4 local_184;
  AssertionResult local_180;
  string local_170 [48];
  iterator local_140;
  key_type local_120;
  dense_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  local_118;
  undefined1 local_f1;
  AssertionResult local_f0;
  string local_e0 [71];
  undefined1 local_99;
  AssertionResult local_98;
  pair<google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  local_88;
  pair<google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  local_48;
  
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::
  pair<google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_true>
            ((pair<google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
              *)in_stack_ffffffffffffea90);
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  ::
  pair<google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_true>
            ((pair<google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
              *)in_stack_ffffffffffffea90);
  local_99 = google::
             BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ::empty((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xd7339a);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffea90,(bool *)in_stack_ffffffffffffea88,
             (type *)0xd733bc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_98);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeac0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
               in_stack_ffffffffffffeaf8,in_stack_ffffffffffffeaf0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeac0,in_stack_ffffffffffffeabc,(char *)in_stack_ffffffffffffeab0
               ,in_stack_ffffffffffffeaac,in_stack_ffffffffffffeaa0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb10,(Message *)in_stack_ffffffffffffeb08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffea90);
    std::__cxx11::string::~string(local_e0);
    testing::Message::~Message((Message *)0xd7347d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd73514);
  local_120 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaac);
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffead0,in_stack_ffffffffffffeac8);
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffead0);
  local_f1 = google::
             dense_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
             ::operator==(&local_118,&local_140);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffea90,(bool *)in_stack_ffffffffffffea88,
             (type *)0xd735aa);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeac0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
               in_stack_ffffffffffffeaf8,in_stack_ffffffffffffeaf0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeac0,in_stack_ffffffffffffeabc,(char *)in_stack_ffffffffffffeab0
               ,in_stack_ffffffffffffeaac,in_stack_ffffffffffffeaa0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb10,(Message *)in_stack_ffffffffffffeb08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffea90);
    std::__cxx11::string::~string(local_170);
    testing::Message::~Message((Message *)0xd7367d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd73714);
  local_184 = 0;
  local_198 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaac);
  local_190 = google::
              BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(in_stack_ffffffffffffea90,in_stack_ffffffffffffea88);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffeaac,in_stack_ffffffffffffeaa8),
             in_stack_ffffffffffffeaa0,(uint *)in_stack_ffffffffffffea98,
             (unsigned_long *)in_stack_ffffffffffffea90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_180);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeac0);
    testing::AssertionResult::failure_message((AssertionResult *)0xd737d6);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeac0,in_stack_ffffffffffffeabc,(char *)in_stack_ffffffffffffeab0
               ,in_stack_ffffffffffffeaac,in_stack_ffffffffffffeaa0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb10,(Message *)in_stack_ffffffffffffeb08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffea90);
    testing::Message::~Message((Message *)0xd73839);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd738aa);
  local_1f0 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaac);
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(in_stack_ffffffffffffeb60,in_stack_ffffffffffffeb58);
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::operator=(&local_48,&local_1e8);
  local_201 = google::
              dense_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((dense_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_48,&local_48.second.super_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffea90,(bool *)in_stack_ffffffffffffea88,
             (type *)0xd73940);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_200);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeac0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
               in_stack_ffffffffffffeaf8,in_stack_ffffffffffffeaf0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeac0,in_stack_ffffffffffffeabc,(char *)in_stack_ffffffffffffeab0
               ,in_stack_ffffffffffffeaac,in_stack_ffffffffffffeaa0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb10,(Message *)in_stack_ffffffffffffeb08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffea90);
    std::__cxx11::string::~string(local_238);
    testing::Message::~Message((Message *)0xd73a13);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd73aaa);
  HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject(in_stack_ffffffffffffea98,(int)((ulong)in_stack_ffffffffffffea90 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08);
  std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xd73b07);
  bVar1 = google::
          BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          ::empty((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   *)0xd73b18);
  local_281 = (bVar1 ^ 0xffU) & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffea90,(bool *)in_stack_ffffffffffffea88,
             (type *)0xd73b3c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_280);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeac0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
               in_stack_ffffffffffffeaf8,in_stack_ffffffffffffeaf0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeac0,in_stack_ffffffffffffeabc,(char *)in_stack_ffffffffffffeab0
               ,in_stack_ffffffffffffeaac,in_stack_ffffffffffffeaa0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb10,(Message *)in_stack_ffffffffffffeb08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffea90);
    std::__cxx11::string::~string(local_2b8);
    testing::Message::~Message((Message *)0xd73c35);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd73ccc);
  HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject(in_stack_ffffffffffffea98,(int)((ulong)in_stack_ffffffffffffea90 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08);
  std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xd73d29);
  HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject(in_stack_ffffffffffffea98,(int)((ulong)in_stack_ffffffffffffea90 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08);
  std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xd73d86);
  HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject(in_stack_ffffffffffffea98,(int)((ulong)in_stack_ffffffffffffea90 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08);
  std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xd73de3);
  HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject(in_stack_ffffffffffffea98,(int)((ulong)in_stack_ffffffffffffea90 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08);
  std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xd73e40);
  HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject(in_stack_ffffffffffffea98,(int)((ulong)in_stack_ffffffffffffea90 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08);
  std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xd73e9d);
  HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject(in_stack_ffffffffffffea98,(int)((ulong)in_stack_ffffffffffffea90 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08);
  std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xd73efa);
  HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject(in_stack_ffffffffffffea98,(int)((ulong)in_stack_ffffffffffffea90 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08);
  std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xd73f57);
  HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject(in_stack_ffffffffffffea98,(int)((ulong)in_stack_ffffffffffffea90 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08);
  std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xd73fb4);
  local_48c = 9;
  local_498 = google::
              BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xd73fd0);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffeaac,in_stack_ffffffffffffeaa8),
             in_stack_ffffffffffffeaa0,(uint *)in_stack_ffffffffffffea98,
             (unsigned_long *)in_stack_ffffffffffffea90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_488);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeac0);
    testing::AssertionResult::failure_message((AssertionResult *)0xd7417c);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeac0,in_stack_ffffffffffffeabc,(char *)in_stack_ffffffffffffeab0
               ,in_stack_ffffffffffffeaac,in_stack_ffffffffffffeaa0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb10,(Message *)in_stack_ffffffffffffeb08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffea90);
    testing::Message::~Message((Message *)0xd741df);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd74250);
  local_4f0 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaac);
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffead0,in_stack_ffffffffffffeac8);
  it_00.super_iterator.pos._0_4_ = in_stack_ffffffffffffeaa8;
  it_00.super_iterator.ht =
       (dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)local_4d0;
  it_00.super_iterator.pos._4_4_ = in_stack_ffffffffffffeaac;
  it_00.super_iterator.end = (pointer)in_stack_ffffffffffffeab0;
  it_00.parent_._0_4_ = in_stack_ffffffffffffeab8;
  it_00.parent_._4_4_ = in_stack_ffffffffffffeabc;
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::const_iterator::const_iterator((const_iterator *)local_4e0,it_00);
  local_508 = google::
              BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::const_iterator::key((const_iterator *)0xd742da);
  local_510 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaac);
  testing::internal::EqHelper::Compare<const_char_*,_const_char_*,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffeaac,in_stack_ffffffffffffeaa8),local_4d0,
             local_4d8,(char **)local_4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_500);
  key_00 = local_4e8;
  this_04 = local_4e0;
  lhs = local_4d8;
  message = local_4d0;
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeac0);
    testing::AssertionResult::failure_message((AssertionResult *)0xd7436d);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeac0,in_stack_ffffffffffffeabc,(char *)in_stack_ffffffffffffeab0
               ,in_stack_ffffffffffffeaac,local_4d0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb10,(Message *)in_stack_ffffffffffffeb08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4e0);
    testing::Message::~Message((Message *)0xd743d0);
    key_00 = local_4e8;
    this_04 = local_4e0;
    lhs = local_4d8;
    message = local_4d0;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd74441);
  google::
  HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashMap
            ((HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)this_04,key_00);
  local_5e8 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaac);
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffead0,in_stack_ffffffffffffeac8);
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffead0);
  local_5b9 = google::
              dense_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=(&local_5e0,&local_608);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_04,(bool *)key_00,(type *)0xd744fd);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_5b8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeac0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
               in_stack_ffffffffffffeaf8,in_stack_ffffffffffffeaf0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeac0,in_stack_ffffffffffffeabc,(char *)in_stack_ffffffffffffeab0
               ,in_stack_ffffffffffffeaac,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb10,(Message *)in_stack_ffffffffffffeb08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    std::__cxx11::string::~string(local_638);
    testing::Message::~Message((Message *)0xd745eb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd74682);
  local_64c = 1;
  local_660 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaac);
  local_658 = google::
              BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(this_04,(key_type *)key_00);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffeaac,in_stack_ffffffffffffeaa8),message,
             (uint *)lhs,(unsigned_long *)this_04);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_648);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeac0);
    testing::AssertionResult::failure_message((AssertionResult *)0xd7476a);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeac0,in_stack_ffffffffffffeabc,(char *)in_stack_ffffffffffffeab0
               ,in_stack_ffffffffffffeaac,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb10,(Message *)in_stack_ffffffffffffeb08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    testing::Message::~Message((Message *)0xd747cd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd7483e);
  local_6b8 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaac);
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(in_stack_ffffffffffffeb60,in_stack_ffffffffffffeb58);
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::operator=(&local_48,&local_6b0);
  local_6c9 = google::
              dense_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=((dense_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_48,&local_48.second.super_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_04,(bool *)key_00,(type *)0xd748ea);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_6c8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeac0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
               in_stack_ffffffffffffeaf8,in_stack_ffffffffffffeaf0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeac0,in_stack_ffffffffffffeabc,(char *)in_stack_ffffffffffffeab0
               ,in_stack_ffffffffffffeaac,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb10,(Message *)in_stack_ffffffffffffeb08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    std::__cxx11::string::~string(local_700);
    testing::Message::~Message((Message *)0xd749bf);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd74a56);
  local_718 = google::
              BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::iterator::key((iterator *)0xd74a63);
  local_720 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaac);
  testing::internal::EqHelper::Compare<const_char_*,_const_char_*,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffeaac,in_stack_ffffffffffffeaa8),message,lhs,
             (char **)this_04);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_710);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeac0);
    testing::AssertionResult::failure_message((AssertionResult *)0xd74b1c);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeac0,in_stack_ffffffffffffeabc,(char *)in_stack_ffffffffffffeab0
               ,in_stack_ffffffffffffeaac,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb10,(Message *)in_stack_ffffffffffffeb08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    testing::Message::~Message((Message *)0xd74b7f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd74bed);
  google::
  dense_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::operator++((dense_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                *)this_04);
  local_741 = google::
              dense_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((dense_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_48,&local_48.second.super_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_04,(bool *)key_00,(type *)0xd74c31);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_740);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeac0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
               in_stack_ffffffffffffeaf8,in_stack_ffffffffffffeaf0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeac0,in_stack_ffffffffffffeabc,(char *)in_stack_ffffffffffffeab0
               ,in_stack_ffffffffffffeaac,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb10,(Message *)in_stack_ffffffffffffeb08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    std::__cxx11::string::~string(local_778);
    testing::Message::~Message((Message *)0xd74d06);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd74d9d);
  local_7b8 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaac);
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffead0,in_stack_ffffffffffffeac8);
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffead0);
  local_789 = google::
              dense_hashtable_const_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=(&local_7b0,&local_7d8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_04,(bool *)key_00,(type *)0xd74e34);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_788);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeac0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
               in_stack_ffffffffffffeaf8,in_stack_ffffffffffffeaf0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeac0,in_stack_ffffffffffffeabc,(char *)in_stack_ffffffffffffeab0
               ,in_stack_ffffffffffffeaac,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb10,(Message *)in_stack_ffffffffffffeb08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    std::__cxx11::string::~string(local_808);
    testing::Message::~Message((Message *)0xd74f09);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd74fa0);
  local_81c = 1;
  local_830 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaac);
  local_828 = google::
              BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(this_04,(key_type *)key_00);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffeaac,in_stack_ffffffffffffeaa8),message,
             (uint *)lhs,(unsigned_long *)this_04);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_818);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeac0);
    testing::AssertionResult::failure_message((AssertionResult *)0xd75079);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeac0,in_stack_ffffffffffffeabc,(char *)in_stack_ffffffffffffeab0
               ,in_stack_ffffffffffffeaac,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb10,(Message *)in_stack_ffffffffffffeb08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    testing::Message::~Message((Message *)0xd750dc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd7514d);
  local_888 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaac);
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(in_stack_ffffffffffffeb60,in_stack_ffffffffffffeb58);
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  ::operator=(&local_88,&local_880);
  local_899 = google::
              dense_hashtable_const_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=((dense_hashtable_const_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_88,&local_88.second.super_const_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_04,(bool *)key_00,(type *)0xd751ea);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_898);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeac0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
               in_stack_ffffffffffffeaf8,in_stack_ffffffffffffeaf0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeac0,in_stack_ffffffffffffeabc,(char *)in_stack_ffffffffffffeab0
               ,in_stack_ffffffffffffeaac,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb10,(Message *)in_stack_ffffffffffffeb08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    std::__cxx11::string::~string(local_8d0);
    testing::Message::~Message((Message *)0xd752bf);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd75356);
  local_8e8 = google::
              BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::const_iterator::key((const_iterator *)0xd75363);
  local_8f0 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaac);
  testing::internal::EqHelper::Compare<const_char_*,_const_char_*,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffeaac,in_stack_ffffffffffffeaa8),message,lhs,
             (char **)this_04);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_8e0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeac0);
    testing::AssertionResult::failure_message((AssertionResult *)0xd7541c);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeac0,in_stack_ffffffffffffeabc,(char *)in_stack_ffffffffffffeab0
               ,in_stack_ffffffffffffeaac,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb10,(Message *)in_stack_ffffffffffffeb08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    testing::Message::~Message((Message *)0xd7547f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd754ed);
  google::
  dense_hashtable_const_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::operator++((dense_hashtable_const_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                *)this_04);
  local_911 = google::
              dense_hashtable_const_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((dense_hashtable_const_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_88,&local_88.second.super_const_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_04,(bool *)key_00,(type *)0xd75531);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_910);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeac0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
               in_stack_ffffffffffffeaf8,in_stack_ffffffffffffeaf0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeac0,in_stack_ffffffffffffeabc,(char *)in_stack_ffffffffffffeab0
               ,in_stack_ffffffffffffeaac,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb10,(Message *)in_stack_ffffffffffffeb08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    std::__cxx11::string::~string(local_948);
    testing::Message::~Message((Message *)0xd75606);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd7569d);
  local_988 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaac);
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffead0,in_stack_ffffffffffffeac8);
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffead0);
  local_959 = google::
              dense_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=(&local_980,&local_9a8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_04,(bool *)key_00,(type *)0xd75747);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_958);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeac0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
               in_stack_ffffffffffffeaf8,in_stack_ffffffffffffeaf0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeac0,in_stack_ffffffffffffeabc,(char *)in_stack_ffffffffffffeab0
               ,in_stack_ffffffffffffeaac,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb10,(Message *)in_stack_ffffffffffffeb08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    std::__cxx11::string::~string(local_9d8);
    testing::Message::~Message((Message *)0xd7581c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd758b3);
  local_9ec = 1;
  local_a00 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaac);
  local_9f8 = google::
              BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(this_04,(key_type *)key_00);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffeaac,in_stack_ffffffffffffeaa8),message,
             (uint *)lhs,(unsigned_long *)this_04);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_9e8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeac0);
    testing::AssertionResult::failure_message((AssertionResult *)0xd7599b);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeac0,in_stack_ffffffffffffeabc,(char *)in_stack_ffffffffffffeab0
               ,in_stack_ffffffffffffeaac,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb10,(Message *)in_stack_ffffffffffffeb08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    testing::Message::~Message((Message *)0xd759fe);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd75a6f);
  local_a58 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaac);
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(in_stack_ffffffffffffeb60,in_stack_ffffffffffffeb58);
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::operator=(&local_48,&local_a50);
  local_a69 = google::
              dense_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=((dense_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_48,&local_48.second.super_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_04,(bool *)key_00,(type *)0xd75b1b);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a68);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeac0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
               in_stack_ffffffffffffeaf8,in_stack_ffffffffffffeaf0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeac0,in_stack_ffffffffffffeabc,(char *)in_stack_ffffffffffffeab0
               ,in_stack_ffffffffffffeaac,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb10,(Message *)in_stack_ffffffffffffeb08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    std::__cxx11::string::~string(local_aa0);
    testing::Message::~Message((Message *)0xd75bf0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd75c87);
  local_ab8 = google::
              BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::iterator::key((iterator *)0xd75c94);
  local_ac0 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaac);
  testing::internal::EqHelper::Compare<const_char_*,_const_char_*,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffeaac,in_stack_ffffffffffffeaa8),message,lhs,
             (char **)this_04);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_ab0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeac0);
    testing::AssertionResult::failure_message((AssertionResult *)0xd75d4d);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeac0,in_stack_ffffffffffffeabc,(char *)in_stack_ffffffffffffeab0
               ,in_stack_ffffffffffffeaac,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb10,(Message *)in_stack_ffffffffffffeb08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    testing::Message::~Message((Message *)0xd75db0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd75e1e);
  google::
  dense_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::operator++((dense_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                *)this_04);
  local_ae1 = google::
              dense_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((dense_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_48,&local_48.second.super_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_04,(bool *)key_00,(type *)0xd75e62);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_ae0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeac0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
               in_stack_ffffffffffffeaf8,in_stack_ffffffffffffeaf0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeac0,in_stack_ffffffffffffeabc,(char *)in_stack_ffffffffffffeab0
               ,in_stack_ffffffffffffeaac,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb10,(Message *)in_stack_ffffffffffffeb08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    std::__cxx11::string::~string(local_b18);
    testing::Message::~Message((Message *)0xd75f37);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd75fce);
  local_b58 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaac);
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffead0,in_stack_ffffffffffffeac8);
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffead0);
  local_b29 = google::
              dense_hashtable_const_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=(&local_b50,&local_b78);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_04,(bool *)key_00,(type *)0xd76065);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b28);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeac0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
               in_stack_ffffffffffffeaf8,in_stack_ffffffffffffeaf0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeac0,in_stack_ffffffffffffeabc,(char *)in_stack_ffffffffffffeab0
               ,in_stack_ffffffffffffeaac,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb10,(Message *)in_stack_ffffffffffffeb08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    std::__cxx11::string::~string(local_ba8);
    testing::Message::~Message((Message *)0xd7613a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd761d1);
  local_bbc = 1;
  local_bd0 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaac);
  local_bc8 = google::
              BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(this_04,(key_type *)key_00);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffeaac,in_stack_ffffffffffffeaa8),message,
             (uint *)lhs,(unsigned_long *)this_04);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_bb8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeac0);
    testing::AssertionResult::failure_message((AssertionResult *)0xd762aa);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeac0,in_stack_ffffffffffffeabc,(char *)in_stack_ffffffffffffeab0
               ,in_stack_ffffffffffffeaac,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb10,(Message *)in_stack_ffffffffffffeb08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    testing::Message::~Message((Message *)0xd7630d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd7637e);
  local_c28 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaac);
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(in_stack_ffffffffffffeb60,in_stack_ffffffffffffeb58);
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  ::operator=(&local_88,&local_c20);
  local_c39 = google::
              dense_hashtable_const_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=((dense_hashtable_const_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_88,&local_88.second.super_const_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_04,(bool *)key_00,(type *)0xd7641b);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c38);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeac0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
               in_stack_ffffffffffffeaf8,in_stack_ffffffffffffeaf0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeac0,in_stack_ffffffffffffeabc,(char *)in_stack_ffffffffffffeab0
               ,in_stack_ffffffffffffeaac,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb10,(Message *)in_stack_ffffffffffffeb08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    std::__cxx11::string::~string(local_c70);
    testing::Message::~Message((Message *)0xd764f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd76587);
  local_c88 = google::
              BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::const_iterator::key((const_iterator *)0xd76594);
  local_c90 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaac);
  testing::internal::EqHelper::Compare<const_char_*,_const_char_*,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffeaac,in_stack_ffffffffffffeaa8),message,lhs,
             (char **)this_04);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c80);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeac0);
    testing::AssertionResult::failure_message((AssertionResult *)0xd7664d);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeac0,in_stack_ffffffffffffeabc,(char *)in_stack_ffffffffffffeab0
               ,in_stack_ffffffffffffeaac,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb10,(Message *)in_stack_ffffffffffffeb08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    testing::Message::~Message((Message *)0xd766b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd7671e);
  google::
  dense_hashtable_const_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::operator++((dense_hashtable_const_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                *)this_04);
  local_cb1 = google::
              dense_hashtable_const_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((dense_hashtable_const_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_88,&local_88.second.super_const_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_04,(bool *)key_00,(type *)0xd76762);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_cb0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeac0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
               in_stack_ffffffffffffeaf8,in_stack_ffffffffffffeaf0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeac0,in_stack_ffffffffffffeabc,(char *)in_stack_ffffffffffffeab0
               ,in_stack_ffffffffffffeaac,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb10,(Message *)in_stack_ffffffffffffeb08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    std::__cxx11::string::~string(local_ce8);
    testing::Message::~Message((Message *)0xd76837);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd768ce);
  local_d28 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaac);
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffead0,in_stack_ffffffffffffeac8);
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffead0);
  local_cf9 = google::
              dense_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator==(&local_d20,&local_d48);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_04,(bool *)key_00,(type *)0xd76978);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_cf8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeac0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
               in_stack_ffffffffffffeaf8,in_stack_ffffffffffffeaf0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeac0,in_stack_ffffffffffffeabc,(char *)in_stack_ffffffffffffeab0
               ,in_stack_ffffffffffffeaac,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb10,(Message *)in_stack_ffffffffffffeb08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    std::__cxx11::string::~string(local_d78);
    testing::Message::~Message((Message *)0xd76a4d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd76ae4);
  local_d8c = 0;
  local_da0 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaac);
  local_d98 = google::
              BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(this_04,(key_type *)key_00);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffeaac,in_stack_ffffffffffffeaa8),message,
             (uint *)lhs,(unsigned_long *)this_04);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d88);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeac0);
    testing::AssertionResult::failure_message((AssertionResult *)0xd76bcc);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeac0,in_stack_ffffffffffffeabc,(char *)in_stack_ffffffffffffeab0
               ,in_stack_ffffffffffffeaac,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb10,(Message *)in_stack_ffffffffffffeb08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    testing::Message::~Message((Message *)0xd76c2f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd76ca0);
  key = (key_type *)(in_RDI + 0x10);
  this_00 = (BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             *)HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaac);
  local_df8 = this_00;
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(this_00,key);
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::operator=(&local_48,&local_df0);
  local_e09 = google::
              dense_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((dense_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_48,&local_48.second.super_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_04,(bool *)key_00,(type *)0xd76d4c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e08);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeac0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
               in_stack_ffffffffffffeaf8,in_stack_ffffffffffffeaf0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeac0,in_stack_ffffffffffffeabc,(char *)in_stack_ffffffffffffeab0
               ,in_stack_ffffffffffffeaac,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb10,(Message *)in_stack_ffffffffffffeb08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    std::__cxx11::string::~string(local_e40);
    testing::Message::~Message((Message *)0xd76e21);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd76eb8);
  local_e80 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaac);
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffead0,in_stack_ffffffffffffeac8);
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffead0);
  local_e51 = google::
              dense_hashtable_const_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator==(&local_e78,&local_ea0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_04,(bool *)key_00,(type *)0xd76f4f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e50);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeac0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
               in_stack_ffffffffffffeaf8,in_stack_ffffffffffffeaf0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeac0,in_stack_ffffffffffffeabc,(char *)in_stack_ffffffffffffeab0
               ,in_stack_ffffffffffffeaac,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb10,(Message *)in_stack_ffffffffffffeb08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    std::__cxx11::string::~string(local_ed0);
    testing::Message::~Message((Message *)0xd77024);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd770bb);
  local_ee4 = 0;
  local_ef8 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaac);
  local_ef0 = google::
              BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(this_04,(key_type *)key_00);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffeaac,in_stack_ffffffffffffeaa8),message,
             (uint *)lhs,(unsigned_long *)this_04);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_ee0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeac0);
    testing::AssertionResult::failure_message((AssertionResult *)0xd77194);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeac0,in_stack_ffffffffffffeabc,(char *)in_stack_ffffffffffffeab0
               ,in_stack_ffffffffffffeaac,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb10,(Message *)in_stack_ffffffffffffeb08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    testing::Message::~Message((Message *)0xd771f7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd77268);
  local_f50 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaac);
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(this_00,key);
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  ::operator=(&local_88,&local_f48);
  local_f61 = google::
              dense_hashtable_const_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((dense_hashtable_const_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_88,&local_88.second.super_const_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_04,(bool *)key_00,(type *)0xd77305);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f60);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeac0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
               in_stack_ffffffffffffeaf8,in_stack_ffffffffffffeaf0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeac0,in_stack_ffffffffffffeabc,(char *)in_stack_ffffffffffffeab0
               ,in_stack_ffffffffffffeaac,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb10,(Message *)in_stack_ffffffffffffeb08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    std::__cxx11::string::~string(local_f98);
    testing::Message::~Message((Message *)0xd773da);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd77471);
  this_01 = (AssertHelper *)(in_RDI + 0x10);
  local_fd8 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaac);
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffead0,in_stack_ffffffffffffeac8);
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffead0);
  local_fa9 = google::
              dense_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator==(&local_fd0,&local_ff8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_04,(bool *)key_00,(type *)0xd7751b);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_fa8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeac0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_ffffffffffffeb08,in_stack_ffffffffffffeb00,
               in_stack_ffffffffffffeaf8,in_stack_ffffffffffffeaf0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeac0,in_stack_ffffffffffffeabc,(char *)in_stack_ffffffffffffeab0
               ,in_stack_ffffffffffffeaac,message);
    testing::internal::AssertHelper::operator=(this_01,(Message *)in_stack_ffffffffffffeb08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    std::__cxx11::string::~string(local_1028);
    testing::Message::~Message((Message *)0xd775f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd77687);
  local_103c = 0;
  expression_text = (char *)(in_RDI + 0x10);
  assertion_result =
       (AssertionResult *)
       HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       ::UniqueKey(in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaac);
  local_1050 = assertion_result;
  actual_predicate_value =
       (char *)google::
               BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::count(this_04,(key_type *)key_00);
  local_1048 = actual_predicate_value;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffeaac,in_stack_ffffffffffffeaa8),message,
             (uint *)lhs,(unsigned_long *)this_04);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1038);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeac0);
    in_stack_ffffffffffffeaf0 =
         testing::AssertionResult::failure_message((AssertionResult *)0xd77763);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeac0,in_stack_ffffffffffffeabc,(char *)in_stack_ffffffffffffeab0
               ,in_stack_ffffffffffffeaac,message);
    testing::internal::AssertHelper::operator=(this_01,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    testing::Message::~Message((Message *)0xd777c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd77831);
  local_10a8 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaac);
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(this_00,key);
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::operator=(&local_48,&local_10a0);
  local_10b9 = google::
               dense_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               ::operator==((dense_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                             *)&local_48,&local_48.second.super_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_04,(bool *)key_00,(type *)0xd778cb);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_10b8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeac0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,expression_text,actual_predicate_value,in_stack_ffffffffffffeaf0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeac0,in_stack_ffffffffffffeabc,(char *)in_stack_ffffffffffffeab0
               ,in_stack_ffffffffffffeaac,message);
    testing::internal::AssertHelper::operator=(this_01,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    std::__cxx11::string::~string(local_10f0);
    testing::Message::~Message((Message *)0xd779a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd77a37);
  this_02 = (BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             *)HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaac);
  local_1130 = this_02;
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(this_02,in_stack_ffffffffffffeac8);
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(this_02);
  local_1101 = google::
               dense_hashtable_const_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               ::operator==(&local_1128,&local_1150);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_04,(bool *)key_00,(type *)0xd77ac8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1100);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeac0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,expression_text,actual_predicate_value,in_stack_ffffffffffffeaf0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeac0,in_stack_ffffffffffffeabc,(char *)in_stack_ffffffffffffeab0
               ,in_stack_ffffffffffffeaac,message);
    testing::internal::AssertHelper::operator=(this_01,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    std::__cxx11::string::~string(local_1180);
    testing::Message::~Message((Message *)0xd77b9d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd77c34);
  local_1194 = 0;
  local_11a8 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaac);
  this_03 = (AssertHelper *)
            google::
            BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            ::count(this_04,(key_type *)key_00);
  local_11a0 = this_03;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffeaac,in_stack_ffffffffffffeaa8),message,
             (uint *)lhs,(unsigned_long *)this_04);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1190);
  if (!bVar1) {
    testing::Message::Message((Message *)this_03);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0xd77d01);
    in_stack_ffffffffffffeabc = (Type)((ulong)pcVar2 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              (this_03,in_stack_ffffffffffffeabc,(char *)in_stack_ffffffffffffeab0,
               in_stack_ffffffffffffeaac,message);
    testing::internal::AssertHelper::operator=(this_01,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    testing::Message::~Message((Message *)0xd77d5e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd77dcf);
  file = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueKey(in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaac);
  local_1200 = file;
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(this_00,key);
  this_05 = &local_88;
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  ::operator=(this_05,&local_11f8);
  local_1211 = google::
               dense_hashtable_const_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               ::operator==((dense_hashtable_const_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                             *)this_05,&local_88.second.super_const_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_04,(bool *)key_00,(type *)0xd77e60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1210);
  if (!bVar1) {
    testing::Message::Message((Message *)this_03);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,expression_text,actual_predicate_value,in_stack_ffffffffffffeaf0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (this_03,in_stack_ffffffffffffeabc,file,(int)((ulong)this_05 >> 0x20),message);
    testing::internal::AssertHelper::operator=(this_01,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    std::__cxx11::string::~string(local_1248);
    testing::Message::~Message((Message *)0xd77f35);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd77fc9);
  google::
  HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashMap
            ((HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)0xd77fd6);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, FindAndCountAndEqualRange) {
  pair<typename TypeParam::iterator, typename TypeParam::iterator> eq_pair;
  pair<typename TypeParam::const_iterator, typename TypeParam::const_iterator>
      const_eq_pair;

  EXPECT_TRUE(this->ht_.empty());
  EXPECT_TRUE(this->ht_.find(this->UniqueKey(1)) == this->ht_.end());
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(1)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(1));
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  this->ht_.insert(this->UniqueObject(1));
  EXPECT_FALSE(this->ht_.empty());
  this->ht_.insert(this->UniqueObject(11));
  this->ht_.insert(this->UniqueObject(111));
  this->ht_.insert(this->UniqueObject(1111));
  this->ht_.insert(this->UniqueObject(11111));
  this->ht_.insert(this->UniqueObject(111111));
  this->ht_.insert(this->UniqueObject(1111111));
  this->ht_.insert(this->UniqueObject(11111111));
  this->ht_.insert(this->UniqueObject(111111111));
  EXPECT_EQ(9u, this->ht_.size());
  typename TypeParam::const_iterator it = this->ht_.find(this->UniqueKey(1));
  EXPECT_EQ(it.key(), this->UniqueKey(1));

  // Allow testing the const version of the methods as well.
  const TypeParam ht = this->ht_;

  // Some successful lookups (via find, count, and equal_range).
  EXPECT_TRUE(this->ht_.find(this->UniqueKey(1)) != this->ht_.end());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(1)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(1));
  EXPECT_TRUE(eq_pair.first != eq_pair.second);
  EXPECT_EQ(eq_pair.first.key(), this->UniqueKey(1));
  ++eq_pair.first;
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(1)) != ht.end());
  EXPECT_EQ(1u, ht.count(this->UniqueKey(1)));
  const_eq_pair = ht.equal_range(this->UniqueKey(1));
  EXPECT_TRUE(const_eq_pair.first != const_eq_pair.second);
  EXPECT_EQ(const_eq_pair.first.key(), this->UniqueKey(1));
  ++const_eq_pair.first;
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);

  EXPECT_TRUE(this->ht_.find(this->UniqueKey(11111)) != this->ht_.end());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(11111)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(11111));
  EXPECT_TRUE(eq_pair.first != eq_pair.second);
  EXPECT_EQ(eq_pair.first.key(), this->UniqueKey(11111));
  ++eq_pair.first;
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(11111)) != ht.end());
  EXPECT_EQ(1u, ht.count(this->UniqueKey(11111)));
  const_eq_pair = ht.equal_range(this->UniqueKey(11111));
  EXPECT_TRUE(const_eq_pair.first != const_eq_pair.second);
  EXPECT_EQ(const_eq_pair.first.key(), this->UniqueKey(11111));
  ++const_eq_pair.first;
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);

  // Some unsuccessful lookups (via find, count, and equal_range).
  EXPECT_TRUE(this->ht_.find(this->UniqueKey(11112)) == this->ht_.end());
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(11112)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(11112));
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(11112)) == ht.end());
  EXPECT_EQ(0u, ht.count(this->UniqueKey(11112)));
  const_eq_pair = ht.equal_range(this->UniqueKey(11112));
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);

  EXPECT_TRUE(this->ht_.find(this->UniqueKey(11110)) == this->ht_.end());
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(11110)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(11110));
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(11110)) == ht.end());
  EXPECT_EQ(0u, ht.count(this->UniqueKey(11110)));
  const_eq_pair = ht.equal_range(this->UniqueKey(11110));
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);
}